

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Vec_Wec_t * Gia_ManCreateCoSupps(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Vec_Wec_t *p_00;
  Vec_Wec_t *p_01;
  Gia_Obj_t *pObj_00;
  Vec_Int_t *vArr;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  abctime aVar5;
  bool bVar6;
  Vec_Wec_t *vSupps;
  Vec_Wec_t *vSuppsCo;
  int Id;
  int i;
  Gia_Obj_t *pObj;
  abctime clk;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  aVar2 = Abc_Clock();
  iVar1 = Gia_ManCoNum(p);
  p_00 = Vec_WecStart(iVar1);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Vec_WecStart(iVar1);
  vSuppsCo._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar6 = false;
    if (vSuppsCo._4_4_ < iVar1) {
      pObj_00 = Gia_ManCi(p,vSuppsCo._4_4_);
      vSuppsCo._0_4_ = Gia_ObjId(p,pObj_00);
      bVar6 = (int)vSuppsCo != 0;
    }
    if (!bVar6) break;
    pVVar3 = Vec_WecEntry(p_01,(int)vSuppsCo);
    Vec_IntPush(pVVar3,vSuppsCo._4_4_);
    vSuppsCo._4_4_ = vSuppsCo._4_4_ + 1;
  }
  vSuppsCo._0_4_ = 0;
  while( true ) {
    bVar6 = false;
    if ((int)vSuppsCo < p->nObjs) {
      _Id = Gia_ManObj(p,(int)vSuppsCo);
      bVar6 = _Id != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjIsAnd(_Id);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninId0(_Id,(int)vSuppsCo);
      pVVar3 = Vec_WecEntry(p_01,iVar1);
      iVar1 = Gia_ObjFaninId1(_Id,(int)vSuppsCo);
      pVVar4 = Vec_WecEntry(p_01,iVar1);
      vArr = Vec_WecEntry(p_01,(int)vSuppsCo);
      Vec_IntTwoMerge2(pVVar3,pVVar4,vArr);
    }
    vSuppsCo._0_4_ = (int)vSuppsCo + 1;
  }
  vSuppsCo._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar6 = false;
    if (vSuppsCo._4_4_ < iVar1) {
      _Id = Gia_ManCo(p,vSuppsCo._4_4_);
      bVar6 = _Id != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    pVVar3 = Vec_WecEntry(p_00,vSuppsCo._4_4_);
    iVar1 = Gia_ObjFaninId0p(p,_Id);
    pVVar4 = Vec_WecEntry(p_01,iVar1);
    Vec_IntAppend(pVVar3,pVVar4);
    vSuppsCo._4_4_ = vSuppsCo._4_4_ + 1;
  }
  Vec_WecFree(p_01);
  if (fVerbose != 0) {
    aVar5 = Abc_Clock();
    Abc_PrintTime(1,"Support computation",aVar5 - aVar2);
  }
  return p_00;
}

Assistant:

Vec_Wec_t * Gia_ManCreateCoSupps( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Obj_t * pObj; int i, Id;
    Vec_Wec_t * vSuppsCo = Vec_WecStart( Gia_ManCoNum(p) );
    Vec_Wec_t * vSupps = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_ManForEachCiId( p, Id, i )
        Vec_IntPush( Vec_WecEntry(vSupps, Id), i );
    Gia_ManForEachAnd( p, pObj, Id )
        Vec_IntTwoMerge2( Vec_WecEntry(vSupps, Gia_ObjFaninId0(pObj, Id)), 
                          Vec_WecEntry(vSupps, Gia_ObjFaninId1(pObj, Id)), 
                          Vec_WecEntry(vSupps, Id) ); 
    Gia_ManForEachCo( p, pObj, i )
        Vec_IntAppend( Vec_WecEntry(vSuppsCo, i), Vec_WecEntry(vSupps, Gia_ObjFaninId0p(p, pObj)) );
    Vec_WecFree( vSupps );
    if ( fVerbose )
        Abc_PrintTime( 1, "Support computation", Abc_Clock() - clk );
    return vSuppsCo;
}